

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall rlottie::internal::renderer::CompLayer::updateContent(CompLayer *this)

{
  float fVar1;
  int frameNo;
  Clipper *this_00;
  Layer *pLVar2;
  Extra *pEVar3;
  Composition *pCVar4;
  pointer ppLVar5;
  double dVar6;
  long lVar7;
  uint uVar8;
  Layer **layer;
  pointer ppLVar9;
  float fVar10;
  double dVar11;
  VMatrix local_58;
  
  this_00 = (this->mClipper)._M_t.
            super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            ._M_t.
            super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
  if ((this_00 != (Clipper *)0x0) && (((this->super_Layer).mDirtyFlag.i & 1) != 0)) {
    local_58.m33 = (this->super_Layer).mCombinedMatrix.m33;
    local_58.mType = (this->super_Layer).mCombinedMatrix.mType;
    local_58.dirty = (this->super_Layer).mCombinedMatrix.dirty;
    local_58._38_2_ = *(undefined2 *)&(this->super_Layer).mCombinedMatrix.field_0x26;
    local_58.m11 = (this->super_Layer).mCombinedMatrix.m11;
    local_58.m12 = (this->super_Layer).mCombinedMatrix.m12;
    local_58.m13 = (this->super_Layer).mCombinedMatrix.m13;
    local_58.m21 = (this->super_Layer).mCombinedMatrix.m21;
    local_58.m22 = (this->super_Layer).mCombinedMatrix.m22;
    local_58.m23 = (this->super_Layer).mCombinedMatrix.m23;
    local_58.mtx = (this->super_Layer).mCombinedMatrix.mtx;
    local_58.mty = (this->super_Layer).mCombinedMatrix.mty;
    Clipper::update(this_00,&local_58);
  }
  pLVar2 = (this->super_Layer).mLayerData;
  frameNo = (this->super_Layer).mFrameNo;
  pEVar3 = (pLVar2->mExtra)._M_t.
           super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl;
  if ((pEVar3 == (Extra *)0x0) || ((pEVar3->mTimeRemap).isValue_ == true)) {
    uVar8 = frameNo - pLVar2->mStartFrame;
  }
  else {
    pCVar4 = pEVar3->mCompRef;
    fVar10 = model::KeyFrames<float,_void>::value((pEVar3->mTimeRemap).impl_,frameNo);
    lVar7 = pCVar4->mEndFrame - pCVar4->mStartFrame;
    dVar11 = (double)fVar10 / (double)((float)lVar7 / pCVar4->mFrameRate);
    dVar6 = 0.0;
    if (0.0 <= dVar11) {
      dVar6 = dVar11;
    }
    dVar11 = 1.0;
    if (dVar6 <= 1.0) {
      dVar11 = dVar6;
    }
    dVar11 = round((double)lVar7 * dVar11);
    uVar8 = (uint)(long)dVar11 |
            (uint)(long)(dVar11 - 9.223372036854776e+18) & (uint)((long)dVar11 >> 0x3f);
  }
  if ((this->super_Layer).mComplexContent == false) {
    fVar10 = (this->super_Layer).mCombinedAlpha;
  }
  else {
    fVar10 = 1.0;
  }
  ppLVar9 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar5 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar9 != ppLVar5) {
    fVar1 = pLVar2->mTimeStreatch;
    do {
      local_58.m33 = (this->super_Layer).mCombinedMatrix.m33;
      local_58.mType = (this->super_Layer).mCombinedMatrix.mType;
      local_58.dirty = (this->super_Layer).mCombinedMatrix.dirty;
      local_58._38_2_ = *(undefined2 *)&(this->super_Layer).mCombinedMatrix.field_0x26;
      local_58.m11 = (this->super_Layer).mCombinedMatrix.m11;
      local_58.m12 = (this->super_Layer).mCombinedMatrix.m12;
      local_58.m13 = (this->super_Layer).mCombinedMatrix.m13;
      local_58.m21 = (this->super_Layer).mCombinedMatrix.m21;
      local_58.m22 = (this->super_Layer).mCombinedMatrix.m22;
      local_58.m23 = (this->super_Layer).mCombinedMatrix.m23;
      local_58.mtx = (this->super_Layer).mCombinedMatrix.mtx;
      local_58.mty = (this->super_Layer).mCombinedMatrix.mty;
      (*(*ppLVar9)->_vptr_Layer[2])
                (fVar10,*ppLVar9,(ulong)(uint)(int)((float)(int)uVar8 / fVar1),&local_58);
      ppLVar9 = ppLVar9 + 1;
    } while (ppLVar9 != ppLVar5);
  }
  return;
}

Assistant:

void renderer::CompLayer::updateContent()
{
    if (mClipper && flag().testFlag(DirtyFlagBit::Matrix)) {
        mClipper->update(combinedMatrix());
    }
    int   mappedFrame = mLayerData->timeRemap(frameNo());
    float alpha = combinedAlpha();
    if (complexContent()) alpha = 1;
    for (const auto &layer : mLayers) {
        layer->update(mappedFrame, combinedMatrix(), alpha);
    }
}